

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os.cc
# Opt level: O1

void __thiscall xemmai::t_child::f_wait(t_child *this,int a_options)

{
  __pid_t _Var1;
  int *piVar2;
  int iVar3;
  
  if (this->v_pid != 0) {
    do {
      _Var1 = waitpid(this->v_pid,&this->v_status,a_options);
      iVar3 = 3;
      if ((_Var1 != this->v_pid) && (iVar3 = 1, _Var1 == -1)) {
        piVar2 = __errno_location();
        iVar3 = 0;
        if (*piVar2 != 4) {
          xemmai::portable::f_throw_system_error();
        }
      }
    } while (iVar3 == 0);
    if (iVar3 != 1) {
      this->v_pid = 0;
    }
  }
  return;
}

Assistant:

void f_wait(int a_options)
	{
		if (!v_pid) return;
		while (true) {
			auto pid = waitpid(v_pid, &v_status, a_options);
			if (pid == v_pid) break;
			if (pid != -1) return;
			if (errno != EINTR) portable::f_throw_system_error();
		}
		v_pid = 0;
	}